

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

int __thiscall phosg::Poll::poll(Poll *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  bool bVar1;
  int iVar2;
  pollfd *__fds_00;
  size_type __nfds_00;
  int *piVar3;
  runtime_error *this_00;
  uint *puVar4;
  reference __args;
  int error;
  pollfd *pfd;
  iterator __end1;
  iterator __begin1;
  vector<pollfd,_std::allocator<pollfd>_> *__range1;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  pollfd *ppStack_18;
  int timeout_ms_local;
  Poll *this_local;
  unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
  *ret;
  
  local_1c = (int)__nfds;
  ppStack_18 = __fds;
  this_local = this;
  __fds_00 = std::vector<pollfd,_std::allocator<pollfd>_>::data
                       ((vector<pollfd,_std::allocator<pollfd>_> *)__fds);
  __nfds_00 = std::vector<pollfd,_std::allocator<pollfd>_>::size
                        ((vector<pollfd,_std::allocator<pollfd>_> *)__fds);
  iVar2 = ::poll((pollfd *)__fds_00,__nfds_00,local_1c);
  if (iVar2 < 0) {
    piVar3 = __errno_location();
    if (*piVar3 != 4) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      puVar4 = (uint *)__errno_location();
      string_for_error_abi_cxx11_(&local_60,(phosg *)(ulong)*puVar4,error);
      ::std::operator+(&local_40,"poll failed: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_60);
      ::std::runtime_error::runtime_error(this_00,(string *)&local_40);
      __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    memset(this,0,0x38);
    std::
    unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
    ::unordered_map((unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
                     *)this);
  }
  else {
    std::
    unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
    ::unordered_map((unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
                     *)this);
    __end1 = std::vector<pollfd,_std::allocator<pollfd>_>::begin
                       ((vector<pollfd,_std::allocator<pollfd>_> *)__fds);
    pfd = (pollfd *)
          std::vector<pollfd,_std::allocator<pollfd>_>::end
                    ((vector<pollfd,_std::allocator<pollfd>_> *)__fds);
    while (bVar1 = __gnu_cxx::operator==<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_>
                             (&__end1,(__normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_>
                                       *)&pfd), ((bVar1 ^ 0xffU) & 1) != 0) {
      __args = __gnu_cxx::__normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_>
               ::operator*(&__end1);
      if (__args->revents != 0) {
        ::std::
        unordered_map<int,short,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,short>>>
        ::emplace<int_const&,short_const&>
                  ((unordered_map<int,short,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,short>>>
                    *)this,&__args->fd,&__args->revents);
      }
      __gnu_cxx::__normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_>::
      operator++(&__end1);
    }
  }
  return (int)this;
}

Assistant:

unordered_map<int, short> Poll::poll(int timeout_ms) {
  if (::poll(this->poll_fds.data(), this->poll_fds.size(), timeout_ms) < 0) {
    if (errno == EINTR) {
      return unordered_map<int, short>();
    }
    throw runtime_error("poll failed: " + string_for_error(errno));
  }

  unordered_map<int, short> ret;
  for (const auto& pfd : this->poll_fds) {
    if (pfd.revents) {
      ret.emplace(pfd.fd, pfd.revents);
    }
  }
  return ret;
}